

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<yb::PrintBuffer_const&>::
captureExpression<(Catch::Internal::Operator)0,char[18]>
          (ExpressionLhs<yb::PrintBuffer_const&> *this,char (*rhs) [18])

{
  bool result;
  ResultBuilder *pRVar1;
  char *value;
  string local_88;
  string local_68;
  string local_48;
  
  pRVar1 = *(ResultBuilder **)this;
  result = (bool)yb::PrintBuffer::operator==(*(PrintBuffer **)(this + 8),*rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Detail::unprintableString_abi_cxx11_,
             DAT_00183520 + Detail::unprintableString_abi_cxx11_);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_88);
  Catch::toString_abi_cxx11_(&local_68,(Catch *)rhs,value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }